

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doublingfactorcounter_test.cpp
# Opt level: O2

void __thiscall
TEST_DoublingFactorCounterTest_LittleThreeDragons_TestShell::
TEST_DoublingFactorCounterTest_LittleThreeDragons_TestShell
          (TEST_DoublingFactorCounterTest_LittleThreeDragons_TestShell *this)

{
  UtestShell::UtestShell(&this->super_UtestShell);
  (this->super_UtestShell)._vptr_UtestShell = (_func_int **)&PTR__ExecFunctionTestShell_001d8a80;
  return;
}

Assistant:

TEST(DoublingFactorCounterTest, LittleThreeDragons)
{
	addPair(Tile::WhiteDragon);
	addTriplet(Tile::RedDragon, true);
	addTriplet(Tile::GreenDragon, false);
	addSequence(Tile::TwoOfCharacters, false);
	addSequence(Tile::SixOfBamboos, false);

	s.selfDrawn();
	auto r = c.report();

	CHECK_EQUAL(1, r.patterns.count(Pattern::LittleThreeDragons));
	CHECK_EQUAL(1, r.patterns.count(Pattern::RedDragon));
	CHECK_EQUAL(1, r.patterns.count(Pattern::GreenDragon));
	CHECK_EQUAL(4, r.doubling_factor);
}